

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O2

void __thiscall
FastPForLib::FastPForTest::_genDataWithFixBits
          (FastPForTest *this,vector<int,_std::allocator<int>_> *v,uint32_t bits,uint32_t values)

{
  pointer piVar1;
  result_type_conflict2 rVar2;
  ulong uVar3;
  bool bVar4;
  uint local_a04;
  uniform_int_distribution<unsigned_int> dist;
  mt19937_64 e2;
  
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1;
  }
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&e2,0x1e240);
  uVar3 = (ulong)values;
  dist._M_param._M_b = ~(-1 << (bits & 0x1f));
  if (bits == 0x20) {
    dist._M_param._M_b = 0xffffffff;
  }
  dist._M_param._M_a = 0;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()(&dist,&e2);
    local_a04 = rVar2 | 1 << ((byte)((char)bits - 1) & 0x1f);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(v,(int *)&local_a04);
  }
  return;
}

Assistant:

void _genDataWithFixBits(
                                 std::vector<int32_t>& v,
                                 uint32_t bits,
                                 uint32_t values) {
          v.clear();
          std::mt19937_64 e2(123456);
          std::uniform_int_distribution<uint32_t> dist(
                                  0,
                                  bits == 32 ? ~0U : (1U << bits) - 1);
          for (size_t i = 0; i < values; ++i) {
            v.push_back(static_cast<int32_t>(dist(e2) | 1U << (bits - 1)));
          }
        }